

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
dap::FieldSerializer::field<dap::boolean,void>(FieldSerializer *this,string *name,boolean *v)

{
  int iVar1;
  anon_class_8_1_54a39816 local_48;
  function<bool_(dap::Serializer_*)> local_40;
  boolean *local_20;
  boolean *v_local;
  string *name_local;
  FieldSerializer *this_local;
  
  local_48.v = v;
  local_20 = v;
  v_local = (boolean *)name;
  name_local = (string *)this;
  std::function<bool(dap::Serializer*)>::
  function<dap::FieldSerializer::field<dap::boolean,void>(std::__cxx11::string_const&,dap::boolean_const&)::_lambda(dap::Serializer*)_1_,void>
            ((function<bool(dap::Serializer*)> *)&local_40,&local_48);
  iVar1 = (*this->_vptr_FieldSerializer[2])(this,name,&local_40);
  std::function<bool_(dap::Serializer_*)>::~function(&local_40);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool FieldSerializer::field(const std::string& name, const T& v) {
  return this->field(name, [&](Serializer* s) { return s->serialize(v); });
}